

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O2

void __thiscall helics::zeromq::ZmqCommsSS::queue_tx_function(ZmqCommsSS *this)

{
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *this_00;
  socket_base sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  iterator iVar5;
  _Rb_tree_header *__n;
  int __timeout;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  ActionMessage *command;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 uVar6;
  undefined8 extraout_RDX_11;
  socket_t *brokerSocket_00;
  _Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *cmd;
  context_t *context_;
  _Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *p_Var7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  string_view message;
  string_view message_00;
  route_id rid;
  allocator<char> local_3d9;
  socket_t brokerConnection;
  socket_t brokerSocket;
  vector<char,_std::allocator<char>_> buffer;
  vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> poller;
  shared_ptr<ZmqContextManager> ctx;
  string empty_1;
  vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_> sockets;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  connection_info;
  map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  routes;
  string local_2d8;
  undefined1 local_2b8 [184];
  optional<std::pair<helics::route_id,_helics::ActionMessage>_> tx_msg;
  message_t msg;
  string empty;
  
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  tx_msg.super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>.
  _M_payload.
  super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>.
  super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>._M_payload._0_8_
       = (long)&tx_msg.
                super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
                .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>.
                _M_payload + 0x10;
  tx_msg.super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>.
  _M_payload.
  super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>.
  super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>._M_payload._8_8_
       = 0;
  tx_msg.super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>.
  _M_payload.
  super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>.
  super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>._M_payload.
  _M_value.second.source_id.gid._0_1_ = 0;
  ZmqContextManager::getContextPointer((ZmqContextManager *)&ctx,(string *)&tx_msg);
  std::__cxx11::string::~string((string *)&tx_msg);
  zmq::message_t::message_t(&msg);
  if ((this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress._M_string_length
      != 0) {
    LOCK();
    (this->super_NetworkCommsInterface).hasBroker._M_base._M_i = true;
    UNLOCK();
  }
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &routes._M_t._M_impl.super__Rb_tree_header._M_header;
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  routes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  connection_info._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &connection_info._M_t._M_impl.super__Rb_tree_header._M_header;
  connection_info._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  connection_info._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  connection_info._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  connection_info._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       connection_info._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->super_NetworkCommsInterface).brokerPort < 0) {
    iVar3 = getDefaultPort(10);
    (this->super_NetworkCommsInterface).brokerPort = iVar3;
  }
  if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
    iVar3 = getDefaultPort(10);
    LOCK();
    (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = iVar3;
    UNLOCK();
  }
  zmq::socket_t::socket_t
            (&brokerSocket,
             ((ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             zcontext)._M_t.
             super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
             super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
             super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl,6);
  zmq::socket_t::socket_t
            (&brokerConnection,
             ((ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             zcontext)._M_t.
             super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
             super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
             super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl,5);
  brokerSocket_00 = &brokerSocket;
  iVar3 = initializeBrokerConnections(this,brokerSocket_00,&brokerConnection);
  iVar4 = (int)brokerSocket_00;
  if (iVar3 < 0) {
    iVar3 = 4;
    CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
    zmq::socket_t::close(&brokerSocket,iVar3);
    zmq::socket_t::close(&brokerConnection,iVar3);
  }
  else {
    if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == false) {
      zmq::socket_t::close(&brokerSocket,iVar4);
    }
    if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
      zmq::socket_t::close(&brokerConnection,iVar4);
      CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
    }
    std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::vector
              (&poller,2,(allocator_type *)&tx_msg);
    std::vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>::vector
              (&sockets,2,(allocator_type *)&tx_msg);
    bVar2 = (this->super_NetworkCommsInterface).super_CommsInterface.serverMode;
    uVar8 = (ulong)bVar2;
    loadPoller(&poller,&sockets,&brokerSocket,&brokerConnection,bVar2,
               (bool)((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1));
    iVar3 = 0;
    cmd = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x0;
    CommsInterface::setRxStatus((CommsInterface *)this,CONNECTED);
    this_00 = &(this->super_NetworkCommsInterface).super_CommsInterface.txQueue;
    bVar9 = 0;
    while (iVar4 = (int)cmd, bVar9 == 0) {
      rid.rid = -0x4d3263e0;
      local_2b8._0_4_ = cmd_ignore;
      local_2b8._4_4_ = 0;
      local_2b8._8_4_ = 0;
      local_2b8._12_4_ = -1700000000;
      local_2b8._16_4_ = 0;
      local_2b8._20_4_ = -1700000000;
      local_2b8[0x78] = 0;
      local_2b8[0x79] = 0;
      local_2b8[0x7a] = 0;
      local_2b8[0x7b] = 0;
      local_2b8[0x7c] = 0;
      local_2b8[0x7d] = 0;
      local_2b8[0x7e] = 0;
      local_2b8[0x7f] = 0;
      local_2b8._128_8_ = 0;
      local_2b8[0x68] = 0;
      local_2b8[0x69] = 0;
      local_2b8[0x6a] = 0;
      local_2b8[0x6b] = 0;
      local_2b8[0x6c] = 0;
      local_2b8[0x6d] = 0;
      local_2b8[0x6e] = 0;
      local_2b8[0x6f] = 0;
      local_2b8[0x70] = 0;
      local_2b8[0x71] = 0;
      local_2b8[0x72] = 0;
      local_2b8[0x73] = 0;
      local_2b8[0x74] = 0;
      local_2b8[0x75] = 0;
      local_2b8[0x76] = 0;
      local_2b8[0x77] = 0;
      local_2b8[0x58] = 0;
      local_2b8[0x59] = 0;
      local_2b8[0x5a] = 0;
      local_2b8[0x5b] = 0;
      local_2b8[0x5c] = 0;
      local_2b8[0x5d] = 0;
      local_2b8[0x5e] = 0;
      local_2b8[0x5f] = 0;
      local_2b8[0x60] = 0;
      local_2b8[0x61] = 0;
      local_2b8[0x62] = 0;
      local_2b8[99] = 0;
      local_2b8[100] = 0;
      local_2b8[0x65] = 0;
      local_2b8[0x66] = 0;
      local_2b8[0x67] = 0;
      local_2b8[0x48] = 0;
      local_2b8[0x49] = 0;
      local_2b8[0x4a] = 0;
      local_2b8[0x4b] = 0;
      local_2b8[0x4c] = 0;
      local_2b8[0x4d] = 0;
      local_2b8[0x4e] = 0;
      local_2b8[0x4f] = 0;
      local_2b8[0x50] = 0;
      local_2b8[0x51] = 0;
      local_2b8[0x52] = 0;
      local_2b8[0x53] = 0;
      local_2b8[0x54] = 0;
      local_2b8[0x55] = 0;
      local_2b8[0x56] = 0;
      local_2b8[0x57] = 0;
      local_2b8._56_8_ = 0;
      local_2b8._64_8_ = 0;
      local_2b8._40_8_ = 0;
      local_2b8._48_8_ = 0;
      local_2b8._24_2_ = 0;
      local_2b8._26_2_ = 0;
      local_2b8._28_4_ = 0;
      local_2b8._32_8_ = 0;
      local_2b8._136_8_ = 0x40;
      local_2b8._144_8_ = local_2b8 + 0x40;
      local_2b8._168_8_ = (pointer)0x0;
      local_2b8._176_8_ = (pointer)0x0;
      local_2b8._152_8_ = (byte *)0x0;
      local_2b8._160_8_ = (pointer)0x0;
      gmlc::containers::
      BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
      ::try_pop(&tx_msg,this_00);
      cmd = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x0;
      iVar4 = zmq::poll((pollfd *)&poller,0,__timeout);
      if ((iVar4 < 1) ||
         (uVar6 = extraout_RDX,
         tx_msg.
         super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>.
         _M_payload.
         super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
         .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>.
         _M_engaged == false)) {
        sched_yield();
        uVar6 = extraout_RDX_00;
      }
      for (uVar10 = 0;
          bVar9 = uVar10 < 0x14 &
                  tx_msg.
                  super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
                  .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                  ._M_engaged, bVar9 != 0; uVar10 = uVar10 + 1) {
        ActionMessage::operator=
                  ((ActionMessage *)local_2b8,
                   &tx_msg.
                    super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                    ._M_payload._M_value.second);
        rid.rid = (BaseType)
                  tx_msg.
                  super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
                  .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                  ._M_payload._M_value.first.rid;
        if ((((local_2b8._0_4_ == -60000) || (local_2b8._0_4_ == 0x1000ea60)) ||
            (local_2b8._0_4_ == 60000)) &&
           (tx_msg.
            super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
            .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>.
            _M_payload._M_value.first.rid == -1)) {
          cmd = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                local_2b8;
          bVar2 = processTxControlCmd(this,(ActionMessage *)cmd,&routes,&connection_info);
          uVar6 = extraout_RDX_01;
          if (bVar2) break;
        }
        else {
          if (buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
              ._M_finish !=
              buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
              ._M_start) {
            buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
          }
          ActionMessage::to_vector((ActionMessage *)local_2b8,&buffer);
          if (rid.rid == -1) {
            cmd = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                  &msg;
            iVar3 = processIncomingMessage(this,(message_t *)cmd,&connection_info);
            uVar6 = extraout_RDX_02;
            if (iVar3 < 0) {
              iVar3 = -1;
              break;
            }
          }
          else {
            p_Var7 = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                     &empty;
            if (rid.rid == 0) {
              if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
                cmd = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *
                      )0x1e;
                message._M_str = "no route to broker for message";
                message._M_len = 0x1e;
                CommsInterface::logWarning((CommsInterface *)this,message);
                uVar6 = extraout_RDX_04;
              }
              else {
                empty._M_dataplus._M_p = (pointer)&empty.field_2;
                empty._M_string_length = 0;
                empty.field_2._M_local_buf[0] = '\0';
                cmd = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *
                      )buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
                zmq::detail::socket_base::send
                          (&brokerConnection.super_socket_base,
                           (int)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                           buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish +
                           -(long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start,1,(int)uVar8);
LAB_00232aea:
                std::__cxx11::string::~string((string *)p_Var7);
                uVar6 = extraout_RDX_03;
              }
            }
            else {
              cmd = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                    &rid;
              iVar5 = std::
                      _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::find(&routes._M_t,(key_type *)cmd);
              __n = &routes._M_t._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)iVar5._M_node != __n) {
                std::__cxx11::string::string
                          ((string *)&empty,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &iVar5._M_node[1]._M_parent);
                empty_1._M_dataplus._M_p = (pointer)&empty_1.field_2;
                empty_1._M_string_length = 0;
                empty_1.field_2._M_local_buf[0] = '\0';
                zmq::detail::socket_base::send
                          (&brokerSocket.super_socket_base,
                           (int)(_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                                 *)&empty,(void *)0x2,(size_t)__n,(int)uVar8);
                zmq::detail::socket_base::send
                          (&brokerSocket.super_socket_base,(int)&empty_1,(void *)0x2,(size_t)__n,
                           (int)uVar8);
                cmd = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *
                      )buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
                zmq::detail::socket_base::send
                          (&brokerSocket.super_socket_base,
                           (int)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                           buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish +
                           -(long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start,1,(int)uVar8);
                std::__cxx11::string::~string((string *)&empty_1);
                goto LAB_00232aea;
              }
              if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
                bVar2 = isIgnoreableCommand((ActionMessage *)local_2b8);
                uVar6 = extraout_RDX_06;
                if (!bVar2) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&empty_1,"unknown route and no broker, dropping message ",
                             &local_3d9);
                  prettyPrintString_abi_cxx11_(&local_2d8,(helics *)local_2b8,command);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&empty,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&empty_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_2d8);
                  message_00._M_str = empty._M_dataplus._M_p;
                  message_00._M_len = empty._M_string_length;
                  cmd = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                         *)empty._M_string_length;
                  CommsInterface::logWarning((CommsInterface *)this,message_00);
                  std::__cxx11::string::~string((string *)&empty);
                  std::__cxx11::string::~string((string *)&local_2d8);
                  p_Var7 = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                            *)&empty_1;
                  goto LAB_00232aea;
                }
              }
              else {
                cmd = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *
                      )buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
                zmq::detail::socket_base::send
                          (&brokerConnection.super_socket_base,
                           (int)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                           buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish +
                           -(long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start,1,(int)uVar8);
                uVar6 = extraout_RDX_05;
              }
            }
          }
        }
        if (uVar10 < 0x13) {
          gmlc::containers::
          BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
          ::try_pop((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)&empty,this_00)
          ;
          cmd = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                &empty;
          std::_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>::
          _M_move_assign((_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                          *)&tx_msg,
                         (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                          *)&empty);
          std::_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>::_M_reset
                    ((_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                     &empty);
          uVar6 = extraout_RDX_07;
        }
      }
      iVar4 = 1;
      for (uVar10 = 0; (0 < iVar4 && (uVar10 < 5)); uVar10 = uVar10 + 1) {
        cmd = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x0;
        iVar4 = zmq::poll((pollfd *)&poller,0,(int)uVar6);
        uVar6 = extraout_RDX_08;
        if (0 < iVar4) {
          if (((poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
                super__Vector_impl_data._M_start)->revents & 1) != 0) {
            cmd = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                  *sockets.super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            iVar3 = processRxMessage(this,(socket_t *)cmd,&connection_info);
            uVar6 = extraout_RDX_09;
          }
          if ((((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) &&
              (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0)) &&
             ((poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
               super__Vector_impl_data._M_start[1].revents & 1) != 0)) {
            cmd = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                  sockets.super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[1];
            iVar3 = processRxMessage(this,(socket_t *)cmd,&connection_info);
            uVar6 = extraout_RDX_10;
          }
          bVar9 = iVar3 < 0 | bVar9;
          if (iVar3 == 5) {
            zmq::socket_t::close(&brokerConnection,(int)cmd);
            context_ = ((ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->zcontext)._M_t.
                       super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>
                       .super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl;
            zmq::socket_t::socket_t((socket_t *)&empty,context_,5);
            sVar1 = brokerConnection.super_socket_base;
            brokerConnection.super_socket_base._handle = empty._M_dataplus._M_p;
            empty._M_dataplus._M_p = (pointer)sVar1._handle;
            zmq::socket_t::close((socket_t *)&empty,(int)context_);
            initializeConnectionToBroker(this,&brokerConnection);
            bVar2 = (this->super_NetworkCommsInterface).super_CommsInterface.serverMode;
            uVar8 = (ulong)bVar2;
            cmd = (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                  &sockets;
            loadPoller(&poller,(vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_> *)cmd,
                       &brokerSocket,&brokerConnection,bVar2,
                       (bool)((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1));
            iVar3 = 5;
            uVar6 = extraout_RDX_11;
          }
        }
      }
      std::_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>::_M_reset
                ((_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                 &tx_msg);
      ActionMessage::~ActionMessage((ActionMessage *)local_2b8);
    }
    std::
    _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&routes._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&connection_info._M_t);
    if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
      tx_msg.super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>.
      _M_payload.
      super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
      .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>._M_payload.
      _0_8_ = 0x32;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&tx_msg);
      zmq::socket_t::close(&brokerSocket,iVar4);
    }
    if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) {
      zmq::socket_t::close(&brokerConnection,iVar4);
    }
    iVar3 = 2;
    CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
    if ((this->super_NetworkCommsInterface).super_CommsInterface.rxStatus._M_i == CONNECTED) {
      iVar3 = 2;
      CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
    }
    std::_Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>::~_Vector_base
              (&sockets.super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>);
    std::_Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::~_Vector_base
              (&poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>);
  }
  zmq::socket_t::close(&brokerConnection,iVar3);
  zmq::socket_t::close(&brokerSocket,iVar3);
  CLI::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&connection_info);
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&routes._M_t);
  zmq::message_t::~message_t(&msg);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  CLI::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&buffer);
  return;
}

Assistant:

void ZmqCommsSS::queue_tx_function()
{
    std::vector<char> buffer;
    auto ctx = ZmqContextManager::getContextPointer();
    zmq::message_t msg;

    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }

    // contains mapping between route id and core name
    std::map<route_id, std::string> routes;
    // contains mapping between core name and address
    std::map<std::string, std::string> connection_info;

    if (brokerPort < 0) {
        brokerPort = getDefaultBrokerPort();
    }
    if (PortNumber < 0) {
        PortNumber = getDefaultBrokerPort();
    }
    zmq::socket_t brokerSocket(ctx->getBaseContext(), ZMQ_ROUTER);
    zmq::socket_t brokerConnection(ctx->getBaseContext(), ZMQ_DEALER);
    auto res = initializeBrokerConnections(brokerSocket, brokerConnection);
    if (res < 0) {
        setTxStatus(ConnectionStatus::ERRORED);
        brokerSocket.close();
        brokerConnection.close();
        return;
    }
    // Root broker is set
    if (!serverMode) {
        brokerSocket.close();
    }
    if (!hasBroker) {
        brokerConnection.close();
        setTxStatus(ConnectionStatus::CONNECTED);
    }
    // setTxStatus(ConnectionStatus::CONNECTED);

    std::vector<zmq::pollitem_t> poller(2);
    std::vector<zmq::socket_t*> sockets(2);
    loadPoller(poller, sockets, brokerSocket, brokerConnection, serverMode, hasBroker);

    setRxStatus(ConnectionStatus::CONNECTED);

    int status{0};

    bool haltLoop{false};
    //  std::vector<ActionMessage> txlist;
    while (!haltLoop) {
        route_id rid;
        ActionMessage cmd;
        int count{0};

        // Handle Tx messages first
        auto tx_msg = txQueue.try_pop();
        int rc = zmq::poll(poller, 0L);
        if (!tx_msg || (rc <= 0)) {
            std::this_thread::yield();
        }
        int tx_count{0};
        // Balance between tx and rx processing since both running on single thread
        while (tx_msg && (tx_count < TX_RX_MSG_COUNT)) {
            bool processed{false};
            cmd = std::move(tx_msg->second);
            rid = tx_msg->first;
            if (isProtocolCommand(cmd)) {
                if (rid == control_route) {
                    processed = true;
                    auto close_tx = processTxControlCmd(cmd, routes, connection_info);

                    if (close_tx) {
                        haltLoop = true;
                        break;
                    }
                }
            }
            if (!processed) {
                buffer.clear();
                cmd.to_vector(buffer);
                if (rid == parent_route_id) {
                    if (hasBroker) {
                        std::string empty;
                        brokerConnection.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                              zmq::send_flags::dontwait);
                    } else {
                        logWarning("no route to broker for message");
                    }
                } else if (rid == control_route) {
                    status = processIncomingMessage(msg, connection_info);  //----------> ToCheck
                    if (status < 0) {
                        haltLoop = true;
                        break;
                    }
                } else {
                    // If route found send out through the front end socket connection
                    auto rt_find = routes.find(rid);
                    if (rt_find != routes.end()) {
                        std::string route_name = rt_find->second;
                        std::string empty;
                        // Need to first send identity and empty string
                        brokerSocket.send(route_name, zmq::send_flags::sndmore);
                        brokerSocket.send(empty, zmq::send_flags::sndmore);
                        // Send the actual data
                        brokerSocket.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                          zmq::send_flags::dontwait);
                    } else {
                        if (hasBroker) {
                            brokerConnection.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                                  zmq::send_flags::dontwait);
                        } else {
                            if (!isIgnoreableCommand(cmd)) {
                                logWarning(
                                    std::string("unknown route and no broker, dropping message ") +
                                    prettyPrintString(cmd));
                            }
                        }
                    }
                }
            }
            tx_count++;
            if (tx_count < TX_RX_MSG_COUNT) {
                tx_msg = txQueue.try_pop();
            }
        }

        count = 0;
        rc = 1;
        while ((rc > 0) && (count < 5)) {
            rc = zmq::poll(poller, 0L);

            if (rc > 0) {
                if (zmq::has_message(poller[0])) {
                    status = processRxMessage(*sockets[0], connection_info);
                }
                if (serverMode && hasBroker) {
                    if (zmq::has_message(poller[1])) {
                        status = processRxMessage(*sockets[1], connection_info);
                    }
                }

                if (status < 0) {
                    haltLoop = true;
                }
                if (status == 5) {
                    brokerConnection.close();
                    brokerConnection = zmq::socket_t(ctx->getBaseContext(), ZMQ_DEALER);
                    initializeConnectionToBroker(brokerConnection);
                    loadPoller(
                        poller, sockets, brokerSocket, brokerConnection, serverMode, hasBroker);
                }
            }
            count++;
        }
    }
    routes.clear();
    connection_info.clear();
    if (serverMode) {
        std::this_thread::sleep_for(std::chrono::milliseconds(50));
        brokerSocket.close();
    }
    if (hasBroker) {
        brokerConnection.close();
    }
    setTxStatus(ConnectionStatus::TERMINATED);
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        setRxStatus(ConnectionStatus::TERMINATED);
    }
}